

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbors.c
# Opt level: O2

void allocate_nn_arrays(long n)

{
  long lVar1;
  int iVar2;
  undefined1 auVar3 [16];
  
  lVar1 = max_arrays_size;
  if (max_arrays_size < n) {
    nn = (nn_array *)realloc(nn,n << 6);
    sheared = (Point *)realloc(sheared,n << 4);
    sorted = (long *)realloc(sorted,n * 8);
    aux = (long *)realloc(aux,n * 8);
    auVar3._0_4_ = -(uint)((int)((ulong)nn >> 0x20) == 0 && (int)nn == 0);
    auVar3._4_4_ = -(uint)((int)sheared == 0 && (int)((ulong)sheared >> 0x20) == 0);
    auVar3._8_4_ = -(uint)((int)((ulong)sorted >> 0x20) == 0 && (int)sorted == 0);
    auVar3._12_4_ = -(uint)((int)aux == 0 && (int)((ulong)aux >> 0x20) == 0);
    iVar2 = movmskps((int)aux,auVar3);
    lVar1 = n;
    if (iVar2 != 0) {
      err_exit("Cannot allocate memory in allocate_nn_arrays!");
      lVar1 = n;
    }
  }
  max_arrays_size = lVar1;
  return;
}

Assistant:

void  allocate_nn_arrays( long  n )
{
  if( max_arrays_size < n ) 
  {
    nn      = (nn_array*)realloc( (void*)nn, (size_t)n*sizeof(nn_array) );
    sheared = (Point*)realloc( (void*)sheared, (size_t)n*sizeof(Point) );
    sorted  = (long*)realloc( (void*)sorted, (size_t)n*sizeof(long) );
    aux     = (long*)realloc( (void*)aux, (size_t)n*sizeof(long) );
    if( !nn || !sheared || !sorted || !aux )
    {
      err_exit( "Cannot allocate memory in allocate_nn_arrays!" );
    }
    max_arrays_size = n;
  }
}